

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

double __thiscall embree::Application::log(Application *this,double __x)

{
  _Setw _Var1;
  _Setprecision _Var2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  void *pvVar6;
  string *in_RDX;
  int in_ESI;
  ssize_t log_resident_memory;
  ssize_t log_virtual_memory;
  double log_time;
  ssize_t resident_memory;
  ssize_t virtual_memory;
  double time;
  size_t local_80;
  size_t local_78;
  double local_70;
  
  if (in_ESI <= this->verbosity) {
    __x = getSeconds();
    sVar3 = getVirtualMemoryBytes();
    sVar4 = getResidentMemoryBytes();
    if ((this->log_delta & 1U) == 0) {
      local_70 = this->start_time;
    }
    else {
      local_70 = this->last_time;
    }
    local_70 = __x - local_70;
    local_78 = sVar3;
    if ((this->log_delta & 1U) != 0) {
      local_78 = sVar3 - this->last_virtual_memory;
    }
    local_80 = sVar4;
    if ((this->log_delta & 1U) != 0) {
      local_80 = sVar4 - this->last_resident_memory;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"[ ");
    _Var1 = std::setw(8);
    poVar5 = std::operator<<(poVar5,_Var1);
    _Var2 = std::setprecision(3);
    poVar5 = std::operator<<(poVar5,_Var2);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::fixed);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,local_70);
    poVar5 = std::operator<<(poVar5,"s, ");
    _Var1 = std::setw(8);
    poVar5 = std::operator<<(poVar5,_Var1);
    _Var2 = std::setprecision(2);
    poVar5 = std::operator<<(poVar5,_Var2);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::fixed);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(double)(long)local_78 / 1000000.0);
    poVar5 = std::operator<<(poVar5," MB virtual, ");
    _Var1 = std::setw(8);
    poVar5 = std::operator<<(poVar5,_Var1);
    _Var2 = std::setprecision(2);
    poVar5 = std::operator<<(poVar5,_Var2);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::fixed);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(double)(long)local_80 / 1000000.0);
    poVar5 = std::operator<<(poVar5," MB resident ] ");
    poVar5 = std::operator<<(poVar5,in_RDX);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::fixed);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    this->last_time = __x;
    this->last_virtual_memory = sVar3;
    this->last_resident_memory = sVar4;
  }
  return __x;
}

Assistant:

void Application::log(int verbose, const std::string& str)
  {
    if (verbosity < verbose)
      return;
    
    double time = getSeconds();
    ssize_t virtual_memory = getVirtualMemoryBytes();
    ssize_t resident_memory = getResidentMemoryBytes();

    double log_time = log_delta ? time-last_time : time-start_time;
    ssize_t log_virtual_memory = log_delta ? virtual_memory-last_virtual_memory : virtual_memory;
    ssize_t log_resident_memory = log_delta ? resident_memory-last_resident_memory : resident_memory;
      
    std::cout << "[ "
              << std::setw(8) << std::setprecision(3) << std::fixed << log_time << "s, "
              << std::setw(8) << std::setprecision(2) << std::fixed << double(log_virtual_memory)/1E6 << " MB virtual, "
              << std::setw(8) << std::setprecision(2) << std::fixed << double(log_resident_memory)/1E6 << " MB resident ] "
              << str << std::fixed 
              << std::endl << std::flush;
    
    last_time = time;
    last_virtual_memory = virtual_memory;
    last_resident_memory = resident_memory;
  }